

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall ApprovalTests::Options::Options(Options *this)

{
  Reporter *pRVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  FileOptions *in_stack_ffffffffffffffc0;
  
  this_01 = in_RDI;
  FileOptions::FileOptions(in_stack_ffffffffffffffc0);
  this_00 = (function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)
            (this_01[1].super__Function_base._M_functor._M_pod_data + 8);
  ::std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<std::__cxx11::string(&)(std::__cxx11::string_const&),void>
            (this_01,(_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                      *)this_00);
  pRVar1 = defaultReporter();
  *(Reporter **)((long)&this_01[2].super__Function_base._M_functor + 8) = pRVar1;
  DefaultNamerFactory::getDefaultNamer();
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::operator()(this_00);
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::~function
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)0x10f6f4);
  in_RDI[3].super__Function_base._M_functor._M_pod_data[0] = '\x01';
  return;
}

Assistant:

Options() = default;